

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall
BackwardPass::ProcessBailOutConstants
          (BackwardPass *this,BailOutInfo *bailOutInfo,
          BVSparse<Memory::JitArenaAllocator> *byteCodeUpwardExposedUsed,
          BVSparse<Memory::JitArenaAllocator> *bailoutReferencedArgSymsBv)

{
  RealCount *pRVar1;
  CapturedValues *pCVar2;
  GeneratorBailInInstr *pGVar3;
  StackSym *pSVar4;
  JitArenaAllocator *this_00;
  code *pcVar5;
  Type pSVar6;
  anon_union_8_3_5e50e90d_for_u aVar7;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
  *buffer;
  bool bVar8;
  BOOLEAN BVar9;
  undefined4 *puVar10;
  Type *pTVar11;
  Type pSVar12;
  NodeBase *pNVar13;
  undefined1 local_58 [8];
  EditingIterator iter;
  
  iter.last = (NodeBase *)bailoutReferencedArgSymsBv;
  if (this->tag == BackwardPhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x6e3,"(this->tag != Js::BackwardPhase)","this->tag != Js::BackwardPhase");
    if (!bVar8) {
LAB_003d8485:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar10 = 0;
  }
  else {
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  pCVar2 = bailOutInfo->usedCapturedValues;
  local_58 = (undefined1  [8])pCVar2;
  iter.super_Iterator.list = &pCVar2->constantValues;
  do {
    if (iter.super_Iterator.list ==
        (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar8) goto LAB_003d8485;
      *puVar10 = 0;
    }
    iter.super_Iterator.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
          *)((iter.super_Iterator.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])iter.super_Iterator.list == local_58) {
      pGVar3 = bailOutInfo->bailInInstr;
      local_58 = (undefined1  [8])bailOutInfo->capturedValues;
      iter.super_Iterator.current = (NodeBase *)0x0;
      iter.super_Iterator.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
            *)local_58;
      bVar8 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              ::EditingIterator::Next((EditingIterator *)local_58);
      if (bVar8) {
        do {
          pTVar11 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                    ::Iterator::Data((Iterator *)local_58);
          if (pGVar3 != (GeneratorBailInInstr *)0x0) {
            pSVar4 = pTVar11->key;
            pSVar6 = *(Type *)&pTVar11->value;
            aVar7 = (pTVar11->value).u;
            pSVar12 = (Type)new<Memory::ArenaAllocator>
                                      (0x20,&this->func->m_alloc->super_ArenaAllocator,0x364470);
            pSVar12[1].next = (Type)pSVar4;
            pSVar12[2].next = pSVar6;
            *(anon_union_8_3_5e50e90d_for_u *)(pSVar12 + 3) = aVar7;
            pSVar12->next =
                 (pGVar3->capturedValues).constantValues.super_SListNodeBase<Memory::ArenaAllocator>
                 .next;
            (pGVar3->capturedValues).constantValues.super_SListNodeBase<Memory::ArenaAllocator>.next
                 = pSVar12;
            pRVar1 = &(pGVar3->capturedValues).constantValues.super_RealCount;
            pRVar1->count = pRVar1->count + 1;
          }
          BVar9 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                            (byteCodeUpwardExposedUsed,(pTVar11->key->super_Sym).m_id);
          if ((BVar9 == '\0') &&
             (BVar9 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                                ((BVSparse<Memory::JitArenaAllocator> *)iter.last,
                                 (pTVar11->key->super_Sym).m_id), buffer = iter.super_Iterator.list,
             BVar9 == '\0')) {
            if (this->currentPrePassLoop == (Loop *)0x0) {
              this_00 = this->func->m_alloc;
              SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              ::EditingIterator::UnlinkCurrentNode((EditingIterator *)local_58);
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                        ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                         this_00,buffer,0x20);
            }
          }
          else {
            pNVar13 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                      ::EditingIterator::UnlinkCurrentNode((EditingIterator *)local_58);
            pNVar13->next =
                 (pCVar2->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next;
            (pCVar2->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next = pNVar13;
            pRVar1 = &(pCVar2->constantValues).super_RealCount;
            pRVar1->count = pRVar1->count + 1;
          }
          bVar8 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  ::EditingIterator::Next((EditingIterator *)local_58);
        } while (bVar8);
      }
      return;
    }
    pTVar11 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              ::Iterator::Data((Iterator *)local_58);
    BVSparse<Memory::JitArenaAllocator>::Clear
              (byteCodeUpwardExposedUsed,(pTVar11->key->super_Sym).m_id);
    BVSparse<Memory::JitArenaAllocator>::Clear
              ((BVSparse<Memory::JitArenaAllocator> *)iter.last,(pTVar11->key->super_Sym).m_id);
  } while( true );
}

Assistant:

void
BackwardPass::ProcessBailOutConstants(BailOutInfo * bailOutInfo, BVSparse<JitArenaAllocator> * byteCodeUpwardExposedUsed, BVSparse<JitArenaAllocator>* bailoutReferencedArgSymsBv)
{
    Assert(this->tag != Js::BackwardPhase);

    // Remove constants that we are already going to restore
    SListBase<ConstantStackSymValue> * usedConstantValues = &bailOutInfo->usedCapturedValues->constantValues;
    FOREACH_SLISTBASE_ENTRY(ConstantStackSymValue, value, usedConstantValues)
    {
        byteCodeUpwardExposedUsed->Clear(value.Key()->m_id);
        bailoutReferencedArgSymsBv->Clear(value.Key()->m_id);
    }
    NEXT_SLISTBASE_ENTRY;

    IR::GeneratorBailInInstr* bailInInstr = bailOutInfo->bailInInstr;

    // Find other constants that we need to restore
    FOREACH_SLISTBASE_ENTRY_EDITING(ConstantStackSymValue, value, &bailOutInfo->capturedValues->constantValues, iter)
    {
        if (bailInInstr)
        {
            // Store all captured constant values for the corresponding bailin instr
            bailInInstr->capturedValues.constantValues.PrependNode(this->func->m_alloc, value);
        }

        if (byteCodeUpwardExposedUsed->TestAndClear(value.Key()->m_id) || bailoutReferencedArgSymsBv->TestAndClear(value.Key()->m_id))
        {
            // Constant need to be restore, move it to the restore list
            iter.MoveCurrentTo(usedConstantValues);
        }
        else if (!this->IsPrePass())
        {
            // Constants don't need to be restored, delete
            iter.RemoveCurrent(this->func->m_alloc);
        }
    }
    NEXT_SLISTBASE_ENTRY_EDITING;
}